

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::CompareOperator<float>::doApply
          (Interval *__return_storage_ptr__,CompareOperator<float> *this,EvalContext *param_1,
          IArgs *iargs)

{
  ulong uVar1;
  Interval local_60;
  Interval local_48;
  Interval *local_30;
  IArg1 *arg1;
  IArg0 *arg0;
  IArgs *iargs_local;
  EvalContext *param_1_local;
  CompareOperator<float> *this_local;
  
  arg1 = iargs->a;
  local_30 = iargs->b;
  arg0 = (IArg0 *)iargs;
  iargs_local = (IArgs *)param_1;
  param_1_local = (EvalContext *)this;
  tcu::Interval::Interval(__return_storage_ptr__);
  uVar1 = (**(code **)(*(long *)this + 0x60))(this,arg1,local_30);
  if ((uVar1 & 1) != 0) {
    tcu::Interval::Interval(&local_48,1.0);
    tcu::Interval::operator|=(__return_storage_ptr__,&local_48);
  }
  uVar1 = (**(code **)(*(long *)this + 0x68))(this,arg1,local_30);
  if ((uVar1 & 1) != 0) {
    tcu::Interval::Interval(&local_60,0.0);
    tcu::Interval::operator|=(__return_storage_ptr__,&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval		doApply	(const EvalContext&, const IArgs& iargs) const
	{
		const IArg0&	arg0 = iargs.a;
		const IArg1&	arg1 = iargs.b;
		IRet	ret;

		if (canSucceed(arg0, arg1))
			ret |= true;
		if (canFail(arg0, arg1))
			ret |= false;

		return ret;
	}